

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_interface.h
# Opt level: O2

void __thiscall cppnet::Socket::~Socket(Socket *this)

{
  ~Socket(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Socket() {}